

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

void ddb_ap(long ndims,double *qedims,Integer *ardims,Integer *pedims,long npes,long npdivs,
           long *pdivs)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar3;
  long *in_stack_00000008;
  long idim;
  long g;
  long k;
  long i;
  long bq;
  long local_60;
  long local_58;
  long local_48;
  long local_40;
  long local_30;
  long local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  for (local_58 = 0; local_58 < in_RDI + -1; local_58 = local_58 + 1) {
    lVar2 = dd_lk(in_stack_00000008,local_30,*(double *)(in_RSI + local_58 * 8));
    lVar1 = in_stack_00000008[lVar2];
    *(long *)(in_RCX + local_58 * 8) = lVar1;
    local_60 = local_28 / lVar1;
    if (local_60 < 1) {
      local_60 = 1;
    }
    local_28 = local_60;
    if (local_58 < in_RDI + -2) {
      *(double *)(in_RSI + 8 + local_58 * 8) = (double)local_60;
      for (local_40 = local_58 + 2; local_40 < in_RDI; local_40 = local_40 + 1) {
        *(double *)(in_RSI + 8 + local_58 * 8) =
             *(double *)(in_RSI + 8 + local_58 * 8) /
             ((double)*(long *)(in_RDX + local_40 * 8) /
             (double)*(long *)(in_RDX + 8 + local_58 * 8));
      }
      dVar3 = pow(*(double *)(in_RSI + 8 + local_58 * 8),1.0 / (double)((in_RDI + -1) - local_58));
      *(double *)(in_RSI + 8 + local_58 * 8) = dVar3;
      for (local_40 = local_58 + 2; local_40 < in_RDI; local_40 = local_40 + 1) {
        *(double *)(in_RSI + local_40 * 8) =
             ((double)*(long *)(in_RDX + local_40 * 8) /
             (double)*(long *)(in_RDX + 8 + local_58 * 8)) * *(double *)(in_RSI + 8 + local_58 * 8);
      }
      if (1 < lVar1) {
        local_48 = 1;
        local_40 = lVar2;
        while (local_40 = local_40 + 1, local_40 < local_30) {
          if (in_stack_00000008[local_40] % lVar1 == 0) {
            in_stack_00000008[local_48] = in_stack_00000008[local_40] / lVar1;
            local_48 = local_48 + 1;
          }
        }
        local_30 = local_48;
      }
    }
  }
  *(long *)(in_RCX + (in_RDI + -1) * 8) = local_28;
  return;
}

Assistant:

void ddb_ap(long ndims, double * qedims, Integer * ardims, Integer * pedims,
                  long npes, long npdivs, long * pdivs)
      {
      long bq;
      long i, k, g;
      long idim;
         for(idim=0;idim<ndims-1;idim++){
            g = dd_lk(pdivs,npdivs,qedims[idim]);
            bq = pdivs[g] ;
            pedims[idim] = bq;
            npes /= bq;
            npes = (npes<1) ? 1 : npes;
            if(idim<ndims-2){
               qedims[idim+1] = (double) npes;
               for(i=idim+2;i<ndims;i++) qedims[idim+1] /=
                   (ardims[i]/(double)ardims[idim+1]);
               qedims[idim+1] = (double) pow(qedims[idim+1],
                   1.0/(double)(ndims-1-idim));
               for(i=idim+2;i<ndims;i++){
                   qedims[i] = (ardims[i]/(double)ardims[idim+1])*
                       qedims[idim+1];
               }

               if(bq>1) {
                   for(k=1,i=g+1;i<npdivs;i++){
                       if(pdivs[i]%bq==0) {
                           pdivs[k] = pdivs[i]/bq;
                           k += 1;
                       }
                   }
                   npdivs = k;
               }
            }
         }
         pedims[ndims-1] = npes;
      }